

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O0

void __thiscall
QEvdevTabletHandlerThread::~QEvdevTabletHandlerThread(QEvdevTabletHandlerThread *this)

{
  long lVar1;
  QDeadlineTimer *in_RDI;
  long in_FS_OFFSET;
  QDeadlineTimer *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->t1 = (qint64)&PTR_metaObject_0011c668;
  this_00 = in_RDI;
  QThread::quit();
  QDeadlineTimer::QDeadlineTimer(this_00,(ForeverConstant)((ulong)in_RDI >> 0x20),(TimerType)in_RDI)
  ;
  QThread::wait((QDeadlineTimer *)in_RDI);
  QString::~QString((QString *)0x10fb14);
  QString::~QString((QString *)0x10fb21);
  QDaemonThread::~QDaemonThread((QDaemonThread *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEvdevTabletHandlerThread::~QEvdevTabletHandlerThread()
{
    quit();
    wait();
}